

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O0

SpectrumTexture __thiscall
pbrt::TextureParameterDictionary::GetSpectrumTexture
          (TextureParameterDictionary *this,string *name,Spectrum *defaultValue,
          SpectrumType spectrumType,Allocator alloc)

{
  bool bVar1;
  TaggedPointer *in_RCX;
  string *in_RDX;
  TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumDirectionMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture,_pbrt::GPUSpectrumPtexTexture>
  in_RDI;
  SpectrumType in_stack_00000024;
  string *in_stack_00000028;
  TextureParameterDictionary *in_stack_00000030;
  Allocator in_stack_00000038;
  SpectrumTexture tex;
  SpectrumTexture *in_stack_ffffffffffffff58;
  TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumDirectionMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture,_pbrt::GPUSpectrumPtexTexture>
  this_00;
  string local_58 [32];
  TaggedPointer local_38 [56];
  
  this_00.bits = in_RDI.bits;
  std::__cxx11::string::string(local_58,in_RDX);
  GetSpectrumTextureOrNull(in_stack_00000030,in_stack_00000028,in_stack_00000024,in_stack_00000038);
  std::__cxx11::string::~string(local_58);
  bVar1 = pbrt::TaggedPointer::operator_cast_to_bool(local_38);
  if (bVar1) {
    SpectrumTexture::SpectrumTexture((SpectrumTexture *)in_RCX,in_stack_ffffffffffffff58);
  }
  else {
    bVar1 = pbrt::TaggedPointer::operator_cast_to_bool(in_RCX);
    if (bVar1) {
      pstd::pmr::polymorphic_allocator<std::byte>::
      new_object<pbrt::SpectrumConstantTexture,pbrt::Spectrum&>
                ((polymorphic_allocator<std::byte> *)this_00.bits,(Spectrum *)in_RDX);
      SpectrumTexture::TaggedPointer<pbrt::SpectrumConstantTexture>
                ((SpectrumTexture *)in_RCX,(SpectrumConstantTexture *)in_stack_ffffffffffffff58);
    }
    else {
      SpectrumTexture::TaggedPointer((SpectrumTexture *)in_RCX,in_stack_ffffffffffffff58);
    }
  }
  return (SpectrumTexture)
         (TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumDirectionMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture,_pbrt::GPUSpectrumPtexTexture>
          )in_RDI.bits;
}

Assistant:

SpectrumTexture TextureParameterDictionary::GetSpectrumTexture(std::string name,
                                                               Spectrum defaultValue,
                                                               SpectrumType spectrumType,
                                                               Allocator alloc) const {
    SpectrumTexture tex = GetSpectrumTextureOrNull(name, spectrumType, alloc);
    if (tex)
        return tex;
    else if (defaultValue)
        return alloc.new_object<SpectrumConstantTexture>(defaultValue);
    else
        return nullptr;
}